

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O0

void grasshopper_decrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  grasshopper_w128_t *in_RCX;
  grasshopper_w128_t *in_RDX;
  grasshopper_w128_t *in_RSI;
  grasshopper_w128_t *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar1;
  
  grasshopper_copy128(in_RDX,in_RSI);
  grasshopper_append128multi
            (in_RCX,(grasshopper_w128_t *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (grasshopper_w128_t (*) [256])0x17079d);
  for (iVar1 = 9; 1 < iVar1; iVar1 = iVar1 + -1) {
    grasshopper_append128(in_RDX,in_RDI + iVar1);
    grasshopper_append128multi
              (in_RCX,(grasshopper_w128_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
               (grasshopper_w128_t (*) [256])0x1707dd);
  }
  grasshopper_append128(in_RDX,in_RDI + 1);
  grasshopper_convert128(in_RDX,grasshopper_pi_inv);
  grasshopper_append128(in_RDX,in_RDI);
  return;
}

Assistant:

void grasshopper_decrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    grasshopper_append128multi(buffer, target, grasshopper_l_dec128);

    for (i = 9; i > 1; i--) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_dec128);
    }

    grasshopper_append128(target, &subkeys->k[1]);
    grasshopper_convert128(target, grasshopper_pi_inv);
    grasshopper_append128(target, &subkeys->k[0]);
}